

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_00;
  Counts *pCVar1;
  size_t *psVar2;
  IStreamingReporter *pIVar3;
  int iVar4;
  IMutableContext *pIVar5;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  string local_348;
  string local_328;
  Totals local_308;
  TestCaseInfo local_2d0;
  undefined1 local_1c0 [48];
  undefined1 local_190 [24];
  _Alloc_hider local_178;
  size_t local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_168;
  bool local_158;
  
  local_308.assertions.passed = (this->m_totals).assertions.passed;
  local_308.assertions.failed = (this->m_totals).assertions.failed;
  local_308.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_308.testCases.passed = (this->m_totals).testCases.passed;
  local_308.testCases.failed = (this->m_totals).testCases.failed;
  local_308.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2d0,&testCase->super_TestCaseInfo);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,&local_2d0);
  this->m_activeTestCase = testCase;
  local_1c0._0_8_ = local_1c0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,local_2d0.name._M_dataplus._M_p,
             local_2d0.name._M_dataplus._M_p + local_2d0.name._M_string_length);
  local_190._16_8_ = local_190;
  local_1c0._32_4_ = NotStarted;
  local_190._0_4_ = _S_red;
  local_190._8_8_ = (_Base_ptr)0x0;
  local_170 = 0;
  aStack_168._M_allocated_capacity = 0;
  local_158 = false;
  this_00 = &this->m_testCaseTracker;
  local_178._M_p = (pointer)local_190._16_8_;
  aStack_168._8_8_ = (TestCaseTracker *)local_1c0;
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(this_00,(TestCaseTracker *)local_1c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
               *)(local_1c0 + 0x28));
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_);
  }
LAB_0014afa4:
  do {
    runCurrentTest(this,&local_328,&local_348);
    if ((this_00->nullableValue->m_testCase).m_runState != Completed) {
      iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
      if ((char)iVar4 == '\0') goto LAB_0014afa4;
    }
    pIVar5 = getCurrentMutableContext();
    iVar4 = (*(pIVar5->super_IContext)._vptr_IContext[5])(pIVar5);
    if ((char)iVar4 == '\0') goto LAB_0014afe7;
    iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
    if ((char)iVar4 != '\0') {
LAB_0014afe7:
      Totals::delta(__return_storage_ptr__,&this->m_totals,&local_308);
      pCVar1 = &(this->m_totals).testCases;
      pCVar1->passed = pCVar1->passed + (__return_storage_ptr__->testCases).passed;
      psVar2 = &(this->m_totals).testCases.failed;
      *psVar2 = *psVar2 + (__return_storage_ptr__->testCases).failed;
      psVar2 = &(this->m_totals).testCases.failedButOk;
      *psVar2 = *psVar2 + (__return_storage_ptr__->testCases).failedButOk;
      pIVar3 = (this->m_reporter).m_p;
      iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
      TestCaseStats::TestCaseStats
                ((TestCaseStats *)local_1c0,&local_2d0,__return_storage_ptr__,&local_328,&local_348,
                 SUB41(iVar4,0));
      (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,local_1c0);
      TestCaseStats::~TestCaseStats((TestCaseStats *)local_1c0);
      this->m_activeTestCase = (TestCase *)0x0;
      Option<Catch::SectionTracking::TestCaseTracker>::reset(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.lineInfo.file._M_dataplus._M_p != &local_2d0.lineInfo.file.field_2) {
        operator_delete(local_2d0.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.tagsAsString._M_dataplus._M_p != &local_2d0.tagsAsString.field_2) {
        operator_delete(local_2d0.tagsAsString._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2d0.lcaseTags._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2d0.tags._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.description._M_dataplus._M_p != &local_2d0.description.field_2) {
        operator_delete(local_2d0.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.className._M_dataplus._M_p != &local_2d0.className.field_2) {
        operator_delete(local_2d0.className._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0.name._M_dataplus._M_p != &local_2d0.name.field_2) {
        operator_delete(local_2d0.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }